

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_12ff03::AutowahState::update
          (AutowahState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  pointer paVar1;
  pointer paVar2;
  undefined1 auVar3 [16];
  long lVar4;
  MixParams *mix;
  span<float,_16UL> gains;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fStack_a4;
  float local_70 [16];
  
  mix = target.Main;
  fVar8 = (float)((context->mDevice).mPtr)->Frequency;
  fVar5 = 0.001;
  if (0.001 <= (props->Reverb).Diffusion) {
    fVar5 = (props->Reverb).Diffusion;
  }
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  auVar7._4_4_ = fVar5 * fVar8;
  auVar7._0_4_ = (props->Reverb).Density * fVar8;
  auVar7._8_4_ = fVar8 * 0.0;
  auVar7._12_4_ = fVar8 * 0.0;
  auVar7 = divps(_DAT_00178560,auVar7);
  fVar5 = expf(auVar7._0_4_);
  fStack_a4 = auVar7._4_4_;
  fVar6 = expf(fStack_a4);
  this->mAttackRate = fVar5;
  this->mReleaseRate = fVar6;
  fVar5 = log10f((props->Reverb).Gain);
  this->mResonanceGain = SQRT((fVar5 * 10.0) / 3.0);
  fVar5 = log10f((props->Reverb).GainHF / 31621.0);
  this->mPeakGain = 1.0 - fVar5;
  auVar3._4_4_ = fVar8;
  auVar3._0_4_ = fVar8;
  auVar3._8_4_ = fVar8;
  auVar3._12_4_ = fVar8;
  auVar7 = divps(ZEXT816(0x451b000041a00000),auVar3);
  this->mFreqMinNorm = (float)(int)auVar7._0_8_;
  this->mBandwidthNorm = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
  paVar1 = (mix->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  paVar1 = (slot->Wet).Buffer.mDataEnd;
  paVar2 = (slot->Wet).Buffer.mData;
  if (paVar1 != paVar2) {
    local_70[0xd] = 0.0;
    local_70[0xe] = 0.0;
    local_70[0xf] = 0.0;
    local_70[9] = 0.0;
    local_70[10] = 0.0;
    local_70[0xb] = 0.0;
    local_70[0xc] = 0.0;
    local_70[5] = 0.0;
    local_70[6] = 0.0;
    local_70[7] = 0.0;
    local_70[8] = 0.0;
    local_70[1] = 0.0;
    local_70[2] = 0.0;
    local_70[3] = 0.0;
    local_70[4] = 0.0;
    local_70[0] = 1.0;
    ComputePanGains(mix,local_70,slot->Gain,(span<float,_16UL>)this->mChans[0].TargetGains);
    if ((long)paVar1 - (long)paVar2 != 0x1000) {
      gains.mData = this->mChans[1].TargetGains;
      lVar4 = 0;
      do {
        (local_70 + lVar4)[0] = 0.0;
        (local_70 + lVar4)[1] = 1.0;
        ComputePanGains(mix,local_70,slot->Gain,gains);
        lVar4 = lVar4 + 1;
        gains.mData = gains.mData + 0x22;
      } while (((long)paVar1 - (long)paVar2 >> 0xc) + -1 != lVar4);
    }
  }
  return;
}

Assistant:

void AutowahState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    const auto frequency = static_cast<float>(device->Frequency);

    const float ReleaseTime{clampf(props->Autowah.ReleaseTime, 0.001f, 1.0f)};

    mAttackRate    = std::exp(-1.0f / (props->Autowah.AttackTime*frequency));
    mReleaseRate   = std::exp(-1.0f / (ReleaseTime*frequency));
    /* 0-20dB Resonance Peak gain */
    mResonanceGain = std::sqrt(std::log10(props->Autowah.Resonance)*10.0f / 3.0f);
    mPeakGain      = 1.0f - std::log10(props->Autowah.PeakGain/AL_AUTOWAH_MAX_PEAK_GAIN);
    mFreqMinNorm   = MIN_FREQ / frequency;
    mBandwidthNorm = (MAX_FREQ-MIN_FREQ) / frequency;

    mOutTarget = target.Main->Buffer;
    auto set_gains = [slot,target](auto &chan, al::span<const float,MAX_AMBI_CHANNELS> coeffs)
    { ComputePanGains(target.Main, coeffs.data(), slot->Gain, chan.TargetGains); };
    SetAmbiPanIdentity(std::begin(mChans), slot->Wet.Buffer.size(), set_gains);
}